

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O2

bool __thiscall
GF2::MI<45ul,GF2::MOGrlex<45ul>>::Find<45ul,GF2::MOLex<45ul>>
          (MI<45ul,GF2::MOGrlex<45ul>> *this,MP<45UL,_GF2::MOLex<45UL>_> *polyRight,iterator *pos)

{
  undefined8 uVar1;
  bool bVar2;
  MP<45UL,_GF2::MOGrlex<45UL>_> *pMVar3;
  _List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> _Var4;
  MP<45UL,_GF2::MOGrlex<45UL>_> poly;
  MP<45UL,_GF2::MOGrlex<45UL>_> local_38;
  
  local_38.super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
  super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_38;
  local_38.super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
  super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_38;
  local_38.super_list<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>.
  super__List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>._M_impl._M_node._M_size = 0;
  uVar1 = *(undefined8 *)this;
  pMVar3 = MP<45ul,GF2::MOGrlex<45ul>>::operator=
                     ((MP<45ul,GF2::MOGrlex<45ul>> *)&local_38,polyRight);
  _Var4 = std::
          __lower_bound<std::_List_iterator<GF2::MP<45ul,GF2::MOGrlex<45ul>>>,GF2::MP<45ul,GF2::MOGrlex<45ul>>,__gnu_cxx::__ops::_Iter_less_val>
                    (uVar1,this,pMVar3);
  pos->_M_node = _Var4._M_node;
  if (_Var4._M_node == (_List_node_base *)this) {
    bVar2 = false;
  }
  else {
    bVar2 = MP<45UL,_GF2::MOGrlex<45UL>_>::operator==
                      ((MP<45UL,_GF2::MOGrlex<45UL>_> *)(_Var4._M_node + 1),&local_38);
  }
  std::__cxx11::_List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_>::_M_clear
            ((_List_base<GF2::MM<45UL>,_std::allocator<GF2::MM<45UL>_>_> *)&local_38);
  return bVar2;
}

Assistant:

bool Find(const MP<_m, _O1>& polyRight, iterator& pos)
	{
		MP<_n, _O> poly(_order);
		pos = std::lower_bound(begin(), end(), poly = polyRight);
		return pos != end() && *pos == poly;
	}